

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O1

void NULLCDynamic::Override(NULLCRef dest,NULLCArray code)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  nullres nVar5;
  int iVar6;
  uint *puVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  char *local_840;
  char local_838 [2056];
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                  ,0x25,"void NULLCDynamic::Override(NULLCRef, NULLCArray)");
  }
  if (dest.typeID < *(uint *)(linker + 0x20c)) {
    lVar11 = (ulong)dest.typeID * 0x50;
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar11) != 3) {
      nullcThrowError("Destination variable is not a function",
                      CONCAT44((int)((ulong)register0x00000030 >> 0x20),code.len));
      return;
    }
    if (dest.typeID < *(uint *)(linker + 0x20c)) {
      uVar2 = *(uint *)(*(long *)(linker + 0x200) + 0x24 + lVar11);
      if (*(uint *)(linker + 0x21c) <= uVar2) {
        pcVar8 = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_001223af;
      }
      lVar4 = *(long *)(linker + 0x210);
      uVar3 = *(uint *)(lVar4 + (ulong)uVar2 * 0xc);
      if (uVar3 < *(uint *)(linker + 0x20c)) {
        if (*(int *)(linker + 0x29c) == 0) {
LAB_0012239a:
          pcVar8 = 
          "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
          ;
          goto LAB_001223af;
        }
        iVar6 = NULLC::SafeSprintf(local_838,0x800,"import __last;\r\n%s __override%d(",
                                   (ulong)*(uint *)(*(long *)(linker + 0x200) + (ulong)uVar3 * 0x50)
                                   + *(long *)(linker + 0x290));
        if (dest.typeID < *(uint *)(linker + 0x20c)) {
          pcVar8 = local_838 + iVar6;
          uVar3 = *(uint *)(*(long *)(linker + 0x200) + 0x18 + lVar11);
          if ((ulong)uVar3 != 0) {
            puVar7 = (uint *)(lVar4 + (ulong)uVar2 * 0xc);
            uVar9 = 0;
            do {
              puVar7 = puVar7 + 3;
              if (*(int *)(linker + 0x29c) == 0) goto LAB_0012239a;
              if (*(uint *)(linker + 0x20c) <= *puVar7) goto LAB_00122383;
              uVar1 = uVar9 + 1;
              pcVar10 = ", ";
              if (uVar3 - 1 == uVar9) {
                pcVar10 = "";
              }
              iVar6 = NULLC::SafeSprintf(pcVar8,(long)(((ulong)(uint)((int)local_838 - (int)pcVar8)
                                                       << 0x20) + 0x80000000000) >> 0x20,
                                         "%s arg%d%s",
                                         (ulong)*(uint *)(*(long *)(linker + 0x200) +
                                                         (ulong)*puVar7 * 0x50) +
                                         *(long *)(linker + 0x290),uVar9,pcVar10);
              pcVar8 = pcVar8 + iVar6;
              uVar9 = uVar1;
            } while (uVar3 != uVar1);
          }
          NULLC::SafeSprintf(pcVar8,(long)(((ulong)(uint)((int)local_838 - (int)pcVar8) << 0x20) +
                                          0x80000000000) >> 0x20,"){ %s }",code.ptr);
          Override::overrideID = Override::overrideID + 1;
          nVar5 = nullcCompile(local_838);
          if (nVar5 != '\0') {
            local_840 = (char *)0x0;
            nullcGetBytecodeNoCache(&local_840);
            nVar5 = nullcLinkCode(local_840);
            if (nVar5 != '\0') {
              if (local_840 != (char *)0x0) {
                operator_delete__(local_840);
              }
              nullcRedirectFunction(*(uint *)(dest.ptr + 8),*(int *)(linker + 0x24c) - 1);
              return;
            }
            if (local_840 != (char *)0x0) {
              operator_delete__(local_840);
            }
          }
          pcVar8 = nullcGetLastError();
          nullcThrowError("%s",pcVar8);
          return;
        }
      }
    }
  }
LAB_00122383:
  pcVar8 = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_001223af:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,pcVar8);
}

Assistant:

void Override(NULLCRef dest, NULLCArray code)
	{
		assert(linker);
		static unsigned int overrideID = 0;

		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}

		char tmp[2048];
		char *it = tmp;
		ExternMemberInfo *memberList = &linker->exTypeExtra[linker->exTypes[dest.typeID].memberOffset];
		ExternTypeInfo &returnType = linker->exTypes[memberList[0].type];
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "import __last;\r\n%s __override%d(", &linker->exSymbols[0] + returnType.offsetToName, overrideID);

		for(unsigned int i = 0, memberCount = linker->exTypes[dest.typeID].memberCount; i != memberCount; i++)
			it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "%s arg%d%s", &linker->exSymbols[0] + linker->exTypes[memberList[i + 1].type].offsetToName, i, i == memberCount - 1 ? "" : ", ");
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "){ %s }", code.ptr);
		overrideID++;

		if(!nullcCompile(tmp))
		{
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		char *bytecode = NULL;
		nullcGetBytecodeNoCache(&bytecode);
		if(!nullcLinkCode(bytecode))
		{
			delete[] bytecode;
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		delete[] bytecode;

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, linker->exFunctions.size() - 1);
	}